

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexelFetch2D(ShaderEvalContext *c,TexLookupParams *p)

{
  deInt32 dVar1;
  int iVar2;
  float *pfVar3;
  ConstPixelBufferAccess *pCVar4;
  undefined1 local_54 [16];
  Vector<float,_4> local_44;
  void *local_34;
  undefined8 local_2c;
  deInt32 local_24;
  int local_20;
  int lod;
  int y;
  int x;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  _y = p;
  p_local = (TexLookupParams *)c;
  pfVar3 = tcu::Vector<float,_4>::x(c->in);
  dVar1 = deChopFloatToInt32(*pfVar3);
  iVar2 = tcu::Vector<int,_3>::x(&_y->offset);
  lod = dVar1 + iVar2;
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  dVar1 = deChopFloatToInt32(*pfVar3);
  local_20 = tcu::Vector<int,_3>::y(&_y->offset);
  local_20 = dVar1 + local_20;
  pfVar3 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  local_24 = deChopFloatToInt32(*pfVar3);
  pCVar4 = tcu::TextureLevelPyramid::getLevel
                     (*(TextureLevelPyramid **)p_local[3].bias.m_data,local_24);
  tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_54,(int)pCVar4,lod,local_20)
  ;
  tcu::operator*((tcu *)&local_44,(Vector<float,_4> *)local_54,&_y->scale);
  tcu::operator+((tcu *)&local_34,&local_44,&_y->bias);
  *(void **)p_local[10].scale.m_data = local_34;
  *(undefined8 *)(p_local[10].scale.m_data + 2) = local_2c;
  return;
}

Assistant:

static void evalTexelFetch2D (gls::ShaderEvalContext& c, const TexLookupParams& p)
{
	int	x	= deChopFloatToInt32(c.in[0].x())+p.offset.x();
	int	y	= deChopFloatToInt32(c.in[0].y())+p.offset.y();
	int	lod = deChopFloatToInt32(c.in[1].x());
	c.color = c.textures[0].tex2D->getLevel(lod).getPixel(x, y)*p.scale + p.bias;
}